

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O1

void __thiscall
TPZManVector<TPZEqnArray<long_double>,_10>::Resize
          (TPZManVector<TPZEqnArray<long_double>,_10> *this,int64_t newsize,
          TPZEqnArray<long_double> *object)

{
  undefined8 *puVar1;
  undefined1 auVar2 [16];
  void *pvVar3;
  ulong uVar4;
  long lVar5;
  TPZVec<TPZEqnArray<long_double>_> *pTVar6;
  long lVar7;
  void *pvVar8;
  ulong uVar9;
  TPZEqnArray<long_double> *pTVar10;
  double dVar11;
  
  if (newsize < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.",0x27);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    std::ostream::flush();
    return;
  }
  lVar5 = (this->super_TPZVec<TPZEqnArray<long_double>_>).fNElements;
  if (newsize != lVar5) {
    lVar7 = (this->super_TPZVec<TPZEqnArray<long_double>_>).fNAlloc;
    if (lVar7 < newsize) {
      if (newsize < 0xb) {
        if ((this->super_TPZVec<TPZEqnArray<long_double>_>).fNElements < 1) {
          lVar5 = 0;
        }
        else {
          lVar7 = 0;
          lVar5 = 0;
          do {
            pTVar10 = (this->super_TPZVec<TPZEqnArray<long_double>_>).fStore;
            puVar1 = (undefined8 *)
                     ((long)(pTVar10->fEqStart).super_TPZManVector<int,_100>.fExtAlloc +
                     lVar7 + -0x28);
            *(undefined8 *)(&this->field_0x20 + lVar7) = *puVar1;
            TPZManVector<int,_100>::operator=
                      ((TPZManVector<int,_100> *)(&this->field_0x28 + lVar7),
                       (TPZManVector<int,_100> *)(puVar1 + 1));
            TPZManVector<int,_100>::operator=
                      ((TPZManVector<int,_100> *)(&this->field_0x1d8 + lVar7),
                       (TPZManVector<int,_100> *)
                       ((long)(pTVar10->fEqNumber).super_TPZManVector<int,_100>.fExtAlloc +
                       lVar7 + -0x20));
            TPZManVector<long_double,_1000>::operator=
                      ((TPZManVector<long_double,_1000> *)(&this->field_0x390 + lVar7),
                       (TPZManVector<long_double,_1000> *)
                       ((long)(pTVar10->fEqValues).super_TPZManVector<long_double,_1000>.fExtAlloc +
                       lVar7 + -0x20));
            TPZManVector<int,_1000>::operator=
                      ((TPZManVector<int,_1000> *)(&this->field_0x4230 + lVar7),
                       (TPZManVector<int,_1000> *)
                       ((long)(pTVar10->fIndex).super_TPZManVector<int,_1000>.fExtAlloc +
                       lVar7 + -0x20));
            *(undefined4 *)(&this->field_0x51f0 + lVar7) =
                 *(undefined4 *)((long)&pTVar10->fLastTerm + lVar7);
            lVar5 = lVar5 + 1;
            lVar7 = lVar7 + 0x51e0;
          } while (lVar5 < (this->super_TPZVec<TPZEqnArray<long_double>_>).fNElements);
        }
        lVar7 = newsize - lVar5;
        if (lVar7 != 0 && lVar5 <= newsize) {
          pTVar6 = &this->super_TPZVec<TPZEqnArray<long_double>_> + lVar5 * 0x28f;
          do {
            pTVar6[1]._vptr_TPZVec = *(undefined8 *)object;
            TPZManVector<int,_100>::operator=
                      ((TPZManVector<int,_100> *)((long)(pTVar6 + 1) + 8),
                       &(object->fEqStart).super_TPZManVector<int,_100>);
            TPZManVector<int,_100>::operator=
                      ((TPZManVector<int,_100> *)((long)(pTVar6 + 0xe) + 0x18),
                       &(object->fEqNumber).super_TPZManVector<int,_100>);
            TPZManVector<long_double,_1000>::operator=
                      ((TPZManVector<long_double,_1000> *)((long)(pTVar6 + 0x1c) + 0x10),
                       &(object->fEqValues).super_TPZManVector<long_double,_1000>);
            TPZManVector<int,_1000>::operator=
                      ((TPZManVector<int,_1000> *)((long)(pTVar6 + 0x211) + 0x10),
                       &(object->fIndex).super_TPZManVector<int,_1000>);
            *(int *)((long)(pTVar6 + 0x28f) + 0x10) = object->fLastTerm;
            pTVar6 = pTVar6 + 0x28f;
            lVar7 = lVar7 + -1;
          } while (lVar7 != 0);
        }
        pTVar10 = (this->super_TPZVec<TPZEqnArray<long_double>_>).fStore;
        if (pTVar10 != (TPZEqnArray<long_double> *)0x0 &&
            pTVar10 != (TPZEqnArray<long_double> *)&this->field_0x20) {
          lVar5 = *(long *)&pTVar10[-1].field_0x51d8;
          if (lVar5 != 0) {
            lVar7 = lVar5 * 0x51e0;
            do {
              TPZEqnArray<long_double>::~TPZEqnArray
                        ((TPZEqnArray<long_double> *)
                         ((long)pTVar10[-1].fEqStart.super_TPZManVector<int,_100>.fExtAlloc +
                         lVar7 + -0x28));
              lVar7 = lVar7 + -0x51e0;
            } while (lVar7 != 0);
          }
          operator_delete__(&pTVar10[-1].fLastTerm,lVar5 * 0x51e0 | 0x10);
        }
        (this->super_TPZVec<TPZEqnArray<long_double>_>).fStore =
             (TPZEqnArray<long_double> *)&this->field_0x20;
        (this->super_TPZVec<TPZEqnArray<long_double>_>).fNElements = newsize;
        (this->super_TPZVec<TPZEqnArray<long_double>_>).fNAlloc = 10;
      }
      else {
        dVar11 = (double)lVar7 * 1.2;
        uVar9 = (long)dVar11;
        if (dVar11 < (double)newsize) {
          uVar9 = newsize;
        }
        auVar2._8_8_ = 0;
        auVar2._0_8_ = uVar9;
        uVar4 = 0xffffffffffffffff;
        if (SUB168(auVar2 * ZEXT816(0x51e0),8) == 0) {
          uVar4 = SUB168(auVar2 * ZEXT816(0x51e0),0) | 0x10;
        }
        pvVar3 = operator_new__(uVar4);
        *(ulong *)((long)pvVar3 + 8) = uVar9;
        if (uVar9 != 0) {
          lVar5 = 0;
          pTVar10 = (TPZEqnArray<long_double> *)((long)pvVar3 + 0x10);
          do {
            TPZEqnArray<long_double>::TPZEqnArray(pTVar10);
            lVar5 = lVar5 + -0x51e0;
            pTVar10 = pTVar10 + 1;
          } while (uVar9 * -0x51e0 - lVar5 != 0);
        }
        if ((this->super_TPZVec<TPZEqnArray<long_double>_>).fNElements < 1) {
          lVar5 = 0;
        }
        else {
          lVar7 = 0;
          lVar5 = 0;
          do {
            pTVar10 = (this->super_TPZVec<TPZEqnArray<long_double>_>).fStore;
            puVar1 = (undefined8 *)
                     ((long)(pTVar10->fEqStart).super_TPZManVector<int,_100>.fExtAlloc +
                     lVar7 + -0x28);
            *(undefined8 *)((long)pvVar3 + lVar7 + 0x10) = *puVar1;
            TPZManVector<int,_100>::operator=
                      ((TPZManVector<int,_100> *)((long)pvVar3 + lVar7 + 0x18),
                       (TPZManVector<int,_100> *)(puVar1 + 1));
            TPZManVector<int,_100>::operator=
                      ((TPZManVector<int,_100> *)((long)pvVar3 + lVar7 + 0x1c8),
                       (TPZManVector<int,_100> *)
                       ((long)(pTVar10->fEqNumber).super_TPZManVector<int,_100>.fExtAlloc +
                       lVar7 + -0x20));
            TPZManVector<long_double,_1000>::operator=
                      ((TPZManVector<long_double,_1000> *)((long)pvVar3 + lVar7 + 0x380),
                       (TPZManVector<long_double,_1000> *)
                       ((long)(pTVar10->fEqValues).super_TPZManVector<long_double,_1000>.fExtAlloc +
                       lVar7 + -0x20));
            TPZManVector<int,_1000>::operator=
                      ((TPZManVector<int,_1000> *)((long)pvVar3 + lVar7 + 0x4220),
                       (TPZManVector<int,_1000> *)
                       ((long)(pTVar10->fIndex).super_TPZManVector<int,_1000>.fExtAlloc +
                       lVar7 + -0x20));
            *(undefined4 *)((long)pvVar3 + lVar7 + 0x51e0) =
                 *(undefined4 *)((long)&pTVar10->fLastTerm + lVar7);
            lVar5 = lVar5 + 1;
            lVar7 = lVar7 + 0x51e0;
          } while (lVar5 < (this->super_TPZVec<TPZEqnArray<long_double>_>).fNElements);
        }
        lVar7 = newsize - lVar5;
        if (lVar7 != 0 && lVar5 <= newsize) {
          pvVar8 = (void *)((long)pvVar3 + lVar5 * 0x51e0);
          do {
            *(undefined8 *)((long)pvVar8 + 0x10) = *(undefined8 *)object;
            TPZManVector<int,_100>::operator=
                      ((TPZManVector<int,_100> *)((long)pvVar8 + 0x18),
                       &(object->fEqStart).super_TPZManVector<int,_100>);
            TPZManVector<int,_100>::operator=
                      ((TPZManVector<int,_100> *)((long)pvVar8 + 0x1c8),
                       &(object->fEqNumber).super_TPZManVector<int,_100>);
            TPZManVector<long_double,_1000>::operator=
                      ((TPZManVector<long_double,_1000> *)((long)pvVar8 + 0x380),
                       &(object->fEqValues).super_TPZManVector<long_double,_1000>);
            TPZManVector<int,_1000>::operator=
                      ((TPZManVector<int,_1000> *)((long)pvVar8 + 0x4220),
                       &(object->fIndex).super_TPZManVector<int,_1000>);
            *(int *)((long)pvVar8 + 0x51e0) = object->fLastTerm;
            pvVar8 = (void *)((long)pvVar8 + 0x51e0);
            lVar7 = lVar7 + -1;
          } while (lVar7 != 0);
        }
        pTVar10 = (this->super_TPZVec<TPZEqnArray<long_double>_>).fStore;
        if (pTVar10 != (TPZEqnArray<long_double> *)0x0 &&
            pTVar10 != (TPZEqnArray<long_double> *)&this->field_0x20) {
          lVar5 = *(long *)&pTVar10[-1].field_0x51d8;
          if (lVar5 != 0) {
            lVar7 = lVar5 * 0x51e0;
            do {
              TPZEqnArray<long_double>::~TPZEqnArray
                        ((TPZEqnArray<long_double> *)
                         ((long)pTVar10[-1].fEqStart.super_TPZManVector<int,_100>.fExtAlloc +
                         lVar7 + -0x28));
              lVar7 = lVar7 + -0x51e0;
            } while (lVar7 != 0);
          }
          operator_delete__(&pTVar10[-1].fLastTerm,lVar5 * 0x51e0 | 0x10);
        }
        (this->super_TPZVec<TPZEqnArray<long_double>_>).fStore =
             (TPZEqnArray<long_double> *)((long)pvVar3 + 0x10);
        (this->super_TPZVec<TPZEqnArray<long_double>_>).fNElements = newsize;
        (this->super_TPZVec<TPZEqnArray<long_double>_>).fNAlloc = uVar9;
      }
    }
    else {
      lVar7 = newsize - lVar5;
      if (lVar7 != 0 && lVar5 <= newsize) {
        lVar5 = lVar5 * 0x51e0 + 0x4210;
        do {
          pTVar10 = (this->super_TPZVec<TPZEqnArray<long_double>_>).fStore;
          *(undefined8 *)((long)pTVar10 + lVar5 + -0x4210) = *(undefined8 *)object;
          TPZManVector<int,_100>::operator=
                    ((TPZManVector<int,_100> *)((long)pTVar10 + lVar5 + -0x4208),
                     &(object->fEqStart).super_TPZManVector<int,_100>);
          TPZManVector<int,_100>::operator=
                    ((TPZManVector<int,_100> *)((long)pTVar10 + lVar5 + -0x4058),
                     &(object->fEqNumber).super_TPZManVector<int,_100>);
          TPZManVector<long_double,_1000>::operator=
                    ((TPZManVector<long_double,_1000> *)((long)pTVar10 + lVar5 + -0x3ea0),
                     &(object->fEqValues).super_TPZManVector<long_double,_1000>);
          TPZManVector<int,_1000>::operator=
                    ((TPZManVector<int,_1000> *)
                     ((long)(pTVar10->fEqStart).super_TPZManVector<int,_100>.fExtAlloc +
                     lVar5 + -0x28),&(object->fIndex).super_TPZManVector<int,_1000>);
          *(int *)((long)(pTVar10->fEqValues).super_TPZManVector<long_double,_1000>.fExtAlloc +
                  lVar5 + 0xc30) = object->fLastTerm;
          lVar5 = lVar5 + 0x51e0;
          lVar7 = lVar7 + -1;
        } while (lVar7 != 0);
      }
      (this->super_TPZVec<TPZEqnArray<long_double>_>).fNElements = newsize;
    }
  }
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize, const T& object) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
    if (newsize == this->fNElements)
        return;
#endif

    if (newsize <= this->fNAlloc) {
        for (int64_t i = this->fNElements; i < newsize; i++)
            this->fStore[i] = object;

        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore. Moreover : this->fNElements <= this->fNAlloc
        // <= NumExtAlloc

        int64_t i;

        for (i = 0L; i < this->fNElements; i++) {
            fExtAlloc[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            fExtAlloc[i] = object;

        if (this->fStore != fExtAlloc) delete [] this->fStore;

        this->fStore = fExtAlloc;
        this->fNElements = newsize;
        this->fNAlloc = NumExtAlloc;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs
        int64_t i, realsize = ExpandSize(newsize);

        T* newstore = new T[realsize];

        for (i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            newstore[i] = object;

        if (this->fStore != fExtAlloc)
            delete[]this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}